

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

bool __thiscall
density::
lf_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
::try_dyn_push_copy(lf_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                    *this,progress_guarantee i_progress_guarantee,runtime_type *i_type,
                   void *i_source)

{
  bool bVar1;
  put_transaction<void> local_70;
  undefined1 local_50 [8];
  put_transaction<void> tranasction;
  void *i_source_local;
  runtime_type *i_type_local;
  progress_guarantee i_progress_guarantee_local;
  lf_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  *this_local;
  
  tranasction.m_queue =
       (lf_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
        *)i_source;
  try_start_dyn_push_copy(&local_70,this,i_progress_guarantee,i_type,i_source);
  lf_heter_queue<density::runtime_type<density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::put_transaction<void>::put_transaction<void,void>((put_transaction<void> *)local_50,&local_70);
  put_transaction<void>::~put_transaction(&local_70);
  bVar1 = density::lf_heter_queue::put_transaction::operator_cast_to_bool
                    ((put_transaction *)local_50);
  if (bVar1) {
    put_transaction<void>::commit((put_transaction<void> *)local_50);
  }
  put_transaction<void>::~put_transaction((put_transaction<void> *)local_50);
  return bVar1;
}

Assistant:

bool try_dyn_push_copy(
          progress_guarantee   i_progress_guarantee,
          const runtime_type & i_type,
          const void *         i_source)
        {
            auto tranasction = try_start_dyn_push_copy(i_progress_guarantee, i_type, i_source);
            if (!tranasction)
                return false;
            tranasction.commit();
            return true;
        }